

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

void CB_EXPLORE_ADF::predict_or_learn_cover<false>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  vector<float,_std::allocator<float>_> *this;
  uint uVar1;
  example *peVar2;
  pointer pfVar3;
  action_score *paVar4;
  uint32_t i_2;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  size_t i_1;
  size_t sVar8;
  uint32_t i;
  uint32_t uVar9;
  ulong uVar10;
  cb_explore_adf *pcVar11;
  polyprediction *preds;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar18;
  undefined4 in_XMM2_Db;
  action_score local_a0;
  undefined1 local_98 [16];
  label *local_88;
  multi_ex *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  score_iterator local_50;
  score_iterator local_40;
  undefined1 auVar17 [16];
  
  local_88 = &data->cs_labels;
  GEN_CS::gen_cs_example_ips(examples,local_88);
  uVar9 = 0;
  LEARNER::multiline_learn_or_predict<false>(base,examples,data->offset,0);
  peVar2 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar12 = (long)(peVar2->pred).scalars._end - (long)(peVar2->pred).scalars._begin >> 3;
  uVar10 = data->cover_size;
  fVar18 = (float)(uVar12 & 0xffffffff);
  lVar5 = (uVar12 & 0xffffffff) * data->counter;
  auVar13._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar13._0_8_ = lVar5;
  auVar13._12_4_ = 0x45300000;
  auVar14._8_8_ = auVar13._8_8_ - 1.9342813113834067e+25;
  preds = &peVar2->pred;
  auVar14._0_8_ =
       SQRT(auVar14._8_8_ + ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
  auVar15._4_12_ = auVar14._4_12_;
  auVar15._0_4_ = (float)auVar14._0_8_;
  local_68 = CONCAT44(in_XMM2_Db,fVar18);
  auVar17._0_8_ = auVar15._0_8_;
  auVar17._8_4_ = (int)((ulong)auVar14._0_8_ >> 0x20);
  auVar17._12_4_ = in_XMM2_Db;
  auVar16._8_8_ = auVar17._8_8_;
  auVar16._4_4_ = fVar18;
  auVar16._0_4_ = auVar15._0_4_;
  local_98 = divps(_DAT_00243370,auVar16);
  local_78 = local_98._4_4_;
  pcVar11 = data;
  local_80 = examples;
  fStack_74 = local_78;
  fStack_70 = local_78;
  fStack_6c = local_78;
  v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
  for (; (uint32_t)uVar12 != uVar9; uVar9 = uVar9 + 1) {
    local_a0.score = 0.0;
    pcVar11 = data;
    local_a0.action = uVar9;
    v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,&local_a0);
  }
  pfVar3 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar3) {
    (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar3;
  }
  fVar18 = 1.0 / (float)uVar10;
  if (local_78 <= (float)local_98._0_4_) {
    local_98._0_4_ = local_78;
  }
  this = &data->scores;
  uVar12 = uVar12 & 0xffffffff;
  for (lVar5 = 0; uVar12 * 8 - lVar5 != 0; lVar5 = lVar5 + 8) {
    pcVar11 = (cb_explore_adf *)this;
    std::vector<float,_std::allocator<float>_>::push_back
              (this,(value_type_conflict3 *)((long)&((preds->a_s)._begin)->score + lVar5));
  }
  if (data->first_only == false) {
    sVar7 = fill_tied(pcVar11,(v_array<ACTION_SCORE::action_score> *)&preds->scalars);
    for (sVar8 = 0; sVar7 != sVar8; sVar8 = sVar8 + 1) {
      uVar1 = (preds->a_s)._begin[sVar8].action;
      paVar4 = (data->action_probs)._begin;
      paVar4[uVar1].score = paVar4[uVar1].score + fVar18 / (float)sVar7;
    }
  }
  else {
    uVar1 = ((preds->a_s)._begin)->action;
    paVar4 = (data->action_probs)._begin;
    paVar4[uVar1].score = paVar4[uVar1].score + fVar18;
  }
  uVar10 = 1;
  while (uVar10 < data->cover_size) {
    pcVar11 = (cb_explore_adf *)data->cs_ldf_learner;
    uVar10 = uVar10 + 1;
    GEN_CS::call_cs_ldf<false>
              ((multi_learner *)pcVar11,local_80,&data->cb_labels,local_88,&data->prepped_cs_labels,
               data->offset,uVar10);
    for (uVar6 = 0; uVar12 != uVar6; uVar6 = uVar6 + 1) {
      pfVar3 = (this->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3[uVar6] = (preds->a_s)._begin[uVar6].score + pfVar3[uVar6];
    }
    if (data->first_only == false) {
      sVar7 = fill_tied(pcVar11,(v_array<ACTION_SCORE::action_score> *)&preds->scalars);
      for (sVar8 = 0; sVar7 != sVar8; sVar8 = sVar8 + 1) {
        uVar1 = (preds->a_s)._begin[sVar8].action;
        paVar4 = (data->action_probs)._begin;
        paVar4[uVar1].score = paVar4[uVar1].score + fVar18 / (float)sVar7;
      }
    }
    else {
      uVar1 = ((preds->a_s)._begin)->action;
      paVar4 = (data->action_probs)._begin;
      paVar4[uVar1].score = paVar4[uVar1].score + fVar18;
    }
  }
  local_40._p = (data->action_probs)._begin;
  local_40._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_50._p = (data->action_probs)._end;
  local_50._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            ((float)local_98._0_4_ * (float)local_68,(bool)(data->nounif ^ 1),&local_40,&local_50);
  do_sort(data);
  for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
    (preds->a_s)._begin[uVar10] = (data->action_probs)._begin[uVar10];
  }
  data->counter = data->counter + 1;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.
  const bool is_mtr = data.gen_cs.cb_type == CB_TYPE_MTR;
  if (is_learn)
  {
    if (is_mtr)  // use DR estimates for non-ERM policies in MTR
      GEN_CS::gen_cs_example_dr<true>(data.gen_cs, examples, data.cs_labels);
    else
      GEN_CS::gen_cs_example<false>(data.gen_cs, examples, data.cs_labels);
    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
  {
    GEN_CS::gen_cs_example_ips(examples, data.cs_labels);
    multiline_learn_or_predict<false>(base, examples, data.offset);
  }

  v_array<action_score>& preds = examples[0]->pred.a_s;
  const uint32_t num_actions = (uint32_t)preds.size();

  float additive_probability = 1.f / (float)data.cover_size;
  const float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));
  v_array<action_score>& probs = data.action_probs;
  probs.clear();
  for (uint32_t i = 0; i < num_actions; i++) probs.push_back({i, 0.});
  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(preds[i].score);

  if (!data.first_only)
  {
    size_t tied_actions = fill_tied(data, preds);
    for (size_t i = 0; i < tied_actions; ++i) probs[preds[i].action].score += additive_probability / tied_actions;
  }
  else
    probs[preds[0].action].score += additive_probability;

  float norm = min_prob * num_actions + (additive_probability - min_prob);
  for (size_t i = 1; i < data.cover_size; i++)
  {
    // Create costs of each action based on online cover
    if (is_learn)
    {
      data.cs_labels_2.costs.clear();
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost = data.cs_labels.costs[j].x - data.psi * min_prob / (max(probs[j].score, min_prob) / norm);
        data.cs_labels_2.costs.push_back({pseudo_cost, j, 0., 0.});
      }
      GEN_CS::call_cs_ldf<true>(*(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels_2,
          data.prepped_cs_labels, data.offset, i + 1);
    }
    else
      GEN_CS::call_cs_ldf<false>(
          *(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset, i + 1);

    for (uint32_t i = 0; i < num_actions; i++) data.scores[i] += preds[i].score;
    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      const float add_prob = additive_probability / tied_actions;
      for (size_t i = 0; i < tied_actions; ++i)
      {
        if (probs[preds[i].action].score < min_prob)
          norm += max(0, add_prob - (min_prob - probs[preds[i].action].score));
        else
          norm += add_prob;
        probs[preds[i].action].score += add_prob;
      }
    }
    else
    {
      uint32_t action = preds[0].action;
      if (probs[action].score < min_prob)
        norm += max(0, additive_probability - (min_prob - probs[action].score));
      else
        norm += additive_probability;
      probs[action].score += additive_probability;
    }
  }

  enforce_minimum_probability(min_prob * num_actions, !data.nounif, begin_scores(probs), end_scores(probs));

  do_sort(data);
  for (size_t i = 0; i < num_actions; i++) preds[i] = probs[i];

  ++data.counter;
}